

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapfilter.cpp
# Opt level: O0

void __thiscall
QPixmapConvolutionFilter::setConvolutionKernel
          (QPixmapConvolutionFilter *this,qreal *kernel,int rows,int columns)

{
  undefined1 auVar1 [16];
  QPixmapConvolutionFilterPrivate *pQVar2;
  ulong uVar3;
  qreal *pqVar4;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  QPixmapConvolutionFilterPrivate *d;
  
  pQVar2 = d_func((QPixmapConvolutionFilter *)0x4aae44);
  if (pQVar2->convolutionKernel != (qreal *)0x0) {
    operator_delete__(pQVar2->convolutionKernel);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(in_EDX * in_ECX);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pqVar4 = (qreal *)operator_new__(uVar3);
  pQVar2->convolutionKernel = pqVar4;
  memcpy(pQVar2->convolutionKernel,in_RSI,(long)in_EDX * 8 * (long)in_ECX);
  pQVar2->kernelWidth = in_ECX;
  pQVar2->kernelHeight = in_EDX;
  return;
}

Assistant:

void QPixmapConvolutionFilter::setConvolutionKernel(const qreal *kernel, int rows, int columns)
{
    Q_D(QPixmapConvolutionFilter);
    delete [] d->convolutionKernel;
    d->convolutionKernel = new qreal[rows * columns];
    memcpy(d->convolutionKernel, kernel, sizeof(qreal) * rows * columns);
    d->kernelWidth = columns;
    d->kernelHeight = rows;
}